

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

void board_print(Board *board,_Bool showDownCards)

{
  SPOTTYPE *__ptr;
  byte *in_RDI;
  SPOTTYPE *spotTypes;
  uchar *in_stack_00000008;
  SPOTTYPE spotType;
  Spot *spot;
  uchar spotTypesCount;
  uchar j;
  uchar i;
  undefined7 in_stack_ffffffffffffffe0;
  SPOTTYPE SVar1;
  byte local_c;
  byte local_b;
  byte local_a;
  
  __ptr = board_getSpotTypes((Board *)spot,in_stack_00000008);
  for (local_a = 0; local_a < local_c; local_a = local_a + 1) {
    SVar1 = __ptr[local_a];
    for (local_b = 0; local_b < *in_RDI; local_b = local_b + 1) {
      if (**(SPOTTYPE **)(*(long *)(in_RDI + 8) + (ulong)local_b * 8) == SVar1) {
        spot_print((Spot *)CONCAT17(SVar1,in_stack_ffffffffffffffe0),SUB81((ulong)__ptr >> 0x38,0));
      }
    }
  }
  free(__ptr);
  return;
}

Assistant:

void board_print(Board * board, bool showDownCards)
{
	unsigned char i, j, spotTypesCount;
	Spot * spot;
	SPOTTYPE spotType;
	SPOTTYPE * spotTypes = board_getSpotTypes(board, &spotTypesCount);

	for(i=0;i<spotTypesCount;i++)
	{
		spotType = spotTypes[i];
		for(j=0;j<board->spotsCount;j++)
		{
			spot = board->spots[j];
			if(spot->type==spotType)
				spot_print(spot, showDownCards);
		}
	}

	free(spotTypes);
}